

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLCellLinOp.cpp
# Opt level: O0

void __thiscall amrex::MLCellLinOp::AnyAvgDownResAmr(MLCellLinOp *this,int clev,Any *cres,Any *fres)

{
  int ratio;
  undefined8 in_RCX;
  MultiFab *in_RDX;
  undefined4 in_ESI;
  MLLinOp *in_RDI;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 in_stack_fffffffffffffff0;
  
  Any::get<amrex::MultiFab>((Any *)in_RDI);
  Any::get<amrex::MultiFab>((Any *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  ratio = (*(code *)(((unique_ptr<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
                       *)&in_RDI->_vptr_MLLinOp)->_M_t).
                    super___uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                    .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>._M_head_impl[5].
                    _vptr_innards_base)();
  MLLinOp::AMRRefRatio(in_RDI,in_stack_ffffffffffffffbc);
  EB_average_down((MultiFab *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX,
                  (int)((ulong)in_RCX >> 0x20),(int)in_RCX,ratio);
  return;
}

Assistant:

void
MLCellLinOp::AnyAvgDownResAmr (int clev, Any& cres, Any const& fres) const
{
    AMREX_ASSERT(cres.is<MultiFab>() && fres.is<MultiFab>());
#ifdef AMREX_USE_EB
    amrex::EB_average_down
#else
    amrex::average_down
#endif
        (fres.get<MultiFab>(), cres.get<MultiFab>(), 0, getNComp(), AMRRefRatio(clev));
}